

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestState.h
# Opt level: O2

void __thiscall TestState::TestState(TestState *this,shared_ptr<GameData> *data)

{
  __shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>);
  GameState::GameState(&this->super_GameState,(shared_ptr<GameData> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_GameState)._vptr_GameState = (_func_int **)&PTR_processInput_00195760;
  return;
}

Assistant:

TestState(std::shared_ptr<GameData> data) : GameState(data) { }